

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O0

void arssort(string *strings,size_t scnt)

{
  list a;
  int local_2c;
  list plStack_28;
  int i;
  list listnodes;
  list ptr;
  size_t scnt_local;
  string *strings_local;
  
  a = (list)calloc(scnt,0x18);
  for (local_2c = 0; (ulong)(long)local_2c < scnt; local_2c = local_2c + 1) {
    a[local_2c].str = strings[local_2c];
    if ((ulong)(long)local_2c < scnt - 1) {
      a[local_2c].next = a + (local_2c + 1);
    }
    else {
      a[local_2c].next = (list)0x0;
    }
  }
  plStack_28 = MSD(a,(int)scnt);
  for (local_2c = 0; (ulong)(long)local_2c < scnt; local_2c = local_2c + 1) {
    strings[local_2c] = plStack_28->str;
    plStack_28 = plStack_28->next;
  }
  free(a);
  return;
}

Assistant:

void arssort(string strings[], size_t scnt)
{
   list ptr, listnodes;
   int i;

    /* allocate memory based on the number of strings in the array */
    ptr = listnodes = (list ) calloc(scnt, sizeof(struct listrec));

    /* point the linked list nodes to the strings in the array */
    for( i=0; i<scnt; i++)
    {
        listnodes[i].str = strings[i];
        if (i<(scnt-1))
           listnodes[i].next = &listnodes[i+1]; 
        else
           listnodes[i].next = NULL;
    }

    /* sort */
    listnodes = MSD(listnodes, scnt);

    /* write the strings back into the array */
    for (i = 0;  i < scnt ; i++, listnodes=listnodes->next)
       strings[i] = listnodes->str;

    free(ptr);
}